

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_builder.cc
# Opt level: O2

void __thiscall leveldb::TableBuilder::~TableBuilder(TableBuilder *this)

{
  long lVar1;
  FilterBlockBuilder *this_00;
  Rep *this_01;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->rep_->closed == false) {
    __assert_fail("rep_->closed",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/table/table_builder.cc"
                  ,0x49,"leveldb::TableBuilder::~TableBuilder()");
  }
  this_00 = this->rep_->filter_block;
  if (this_00 != (FilterBlockBuilder *)0x0) {
    FilterBlockBuilder::~FilterBlockBuilder(this_00);
  }
  operator_delete(this_00,0x90);
  this_01 = this->rep_;
  if (this_01 != (Rep *)0x0) {
    Rep::~Rep(this_01);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    operator_delete(this_01,0x218);
    return;
  }
  __stack_chk_fail();
}

Assistant:

TableBuilder::~TableBuilder() {
  assert(rep_->closed);  // Catch errors where caller forgot to call Finish()
  delete rep_->filter_block;
  delete rep_;
}